

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

void __thiscall
cmCTestSubmitHandler::ParseResponse
          (cmCTestSubmitHandler *this,cmCTestSubmitHandlerVectorOfChar *chunk)

{
  cmCTest *pcVar1;
  long lVar2;
  ostream *poVar3;
  string output;
  char *local_288 [4];
  ResponseParser parser;
  ostringstream cmCTestLog_msg;
  
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::
  append<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)&output,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (chunk->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (chunk->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  lVar2 = std::__cxx11::string::find((char *)&output,0x69823e);
  if (lVar2 != -1) {
    ResponseParser::ResponseParser(&parser);
    cmXMLParser::Parse(&parser.super_cmXMLParser,output._M_dataplus._M_p);
    if (parser.Status == STATUS_OK) {
      cmCTest::SetBuildID((this->super_cmCTestGenericHandler).CTest,&parser.BuildID);
    }
    else {
      this->HasErrors = true;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Submission failed: ");
      poVar3 = std::operator<<(poVar3,(string *)&parser.Message);
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x1d5,local_288[0],false);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    ResponseParser::~ResponseParser(&parser);
    if (parser.Status != STATUS_OK) goto LAB_00490df9;
  }
  cmsys::SystemTools::UpperCase((string *)&cmCTestLog_msg,&output);
  std::__cxx11::string::operator=((string *)&output,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  lVar2 = std::__cxx11::string::find((char *)&output,0x692c10);
  if (lVar2 != -1) {
    this->HasWarnings = true;
  }
  lVar2 = std::__cxx11::string::find((char *)&output,0x6c6c24);
  if (lVar2 != -1) {
    this->HasErrors = true;
  }
  if ((this->HasWarnings != false) || (this->HasErrors == true)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   Server Response:\n");
    parser.super_cmXMLParser._vptr_cmXMLParser =
         (_func_int **)
         (chunk->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start;
    parser.super_cmXMLParser._8_8_ =
         (long)(chunk->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)parser.super_cmXMLParser._vptr_cmXMLParser;
    poVar3 = ::operator<<(poVar3,(cmCTestLogWrite *)&parser);
    std::operator<<(poVar3,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1e5,(char *)parser.super_cmXMLParser._vptr_cmXMLParser,false);
    std::__cxx11::string::~string((string *)&parser);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
LAB_00490df9:
  std::__cxx11::string::~string((string *)&output);
  return;
}

Assistant:

void cmCTestSubmitHandler::ParseResponse(
  cmCTestSubmitHandlerVectorOfChar chunk)
{
  std::string output;
  output.append(chunk.begin(), chunk.end());

  if (output.find("<cdash") != std::string::npos) {
    ResponseParser parser;
    parser.Parse(output.c_str());

    if (parser.Status != ResponseParser::STATUS_OK) {
      this->HasErrors = true;
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "   Submission failed: " << parser.Message << std::endl);
      return;
    }
    this->CTest->SetBuildID(parser.BuildID);
  }
  output = cmSystemTools::UpperCase(output);
  if (output.find("WARNING") != std::string::npos) {
    this->HasWarnings = true;
  }
  if (output.find("ERROR") != std::string::npos) {
    this->HasErrors = true;
  }

  if (this->HasWarnings || this->HasErrors) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Server Response:\n"
                 << cmCTestLogWrite(chunk.data(), chunk.size()) << "\n");
  }
}